

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.h
# Opt level: O1

void __thiscall jrtplib::RTCPCompoundPacketBuilder::SDES::Clear(SDES *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  RTPMemoryManager *pRVar3;
  
  for (p_Var1 = (this->sdessources).
                super__List_base<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&this->sdessources; p_Var1 = p_Var1->_M_next) {
    p_Var2 = p_Var1[1]._M_next;
    pRVar3 = (this->super_RTPMemoryObject).mgr;
    if (pRVar3 == (RTPMemoryManager *)0x0) {
      if (p_Var2 != (_List_node_base *)0x0) {
        (**(code **)((long)p_Var2->_M_next + 8))(p_Var2);
      }
    }
    else {
      (**(code **)p_Var2->_M_next)(p_Var2);
      (**(code **)(*(long *)pRVar3 + 0x18))(pRVar3,p_Var2);
    }
  }
  std::__cxx11::
  list<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
  ::clear(&this->sdessources);
  return;
}

Assistant:

void Clear()
		{
			std::list<SDESSource *>::const_iterator it;

			for (it = sdessources.begin() ; it != sdessources.end() ; it++)
				RTPDelete(*it,GetMemoryManager());
			sdessources.clear();
		}